

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

void linenoiseEditDeletePrevWord(linenoiseState *l)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  pcVar1 = l->buf;
  sVar2 = l->pos;
  sVar4 = 0;
  sVar3 = sVar2;
  while ((sVar3 = sVar3 - 1, sVar3 != 0xffffffffffffffff && (pcVar1[sVar3] == ' '))) {
    l->pos = sVar3;
    sVar4 = sVar4 + 1;
  }
  for (; (sVar2 != sVar4 && (pcVar1[sVar3] != ' ')); sVar3 = sVar3 - 1) {
    l->pos = sVar3;
    sVar4 = sVar4 + 1;
  }
  memmove(pcVar1 + sVar3 + 1,pcVar1 + sVar2,(l->len - sVar2) + 1);
  l->len = l->len - sVar4;
  linenoiseRefreshLine();
  return;
}

Assistant:

void linenoiseEditDeletePrevWord(struct linenoiseState *l) {
    size_t old_pos = l->pos;
    size_t diff;

    while (l->pos > 0 && l->buf[l->pos-1] == ' ')
        l->pos--;
    while (l->pos > 0 && l->buf[l->pos-1] != ' ')
        l->pos--;
    diff = old_pos - l->pos;
    memmove(l->buf+l->pos,l->buf+old_pos,l->len-old_pos+1);
    l->len -= diff;
    linenoiseRefreshLine();
}